

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mhash.h
# Opt level: O1

void mh_assoc_resize(mh_assoc_t *h,void *arg)

{
  uint uVar1;
  mh_assoc_t *pmVar2;
  assoc_val **ppaVar3;
  mh_int_t *pmVar4;
  assoc_val **ppaVar5;
  assoc_val *paVar6;
  mh_int_t mVar7;
  mh_int_t mVar8;
  uint32_t uVar9;
  int iVar10;
  mh_int_t mVar11;
  uint *puVar12;
  int iVar13;
  uint uVar14;
  ulong uVar15;
  ulong uVar16;
  uint uVar17;
  uint uVar18;
  ulong uVar19;
  bool bVar20;
  
  pmVar2 = h->shadow;
  uVar15 = (ulong)h->resize_position;
  if (h->resize_position < h->n_buckets) {
    mVar11 = h->batch;
    do {
      bVar20 = mVar11 == 0;
      mVar11 = mVar11 - 1;
      if (bVar20) {
        h->resize_position = (uint)uVar15;
        return;
      }
      if ((h->b[uVar15 >> 4 & 0xfffffff] >> ((uint)uVar15 & 0xf) & 1) != 0) {
        ppaVar3 = h->p;
        uVar9 = PMurHash32(0xd,(ppaVar3[uVar15]->key).id,(ppaVar3[uVar15]->key).id_len);
        uVar16 = (ulong)uVar9 % (ulong)pmVar2->n_buckets;
        iVar13 = uVar9 % (pmVar2->n_buckets - 1) + 1;
        pmVar4 = pmVar2->b;
        uVar17 = pmVar4[uVar16 >> 4];
        uVar14 = (uint)uVar16 & 0xf;
        if ((uVar17 >> uVar14 & 1) != 0) {
          puVar12 = pmVar4 + (uVar16 >> 4);
          ppaVar5 = pmVar2->p;
          paVar6 = ppaVar3[uVar15];
          do {
            uVar18 = (ppaVar5[uVar16]->key).id_len;
            if (((paVar6->key).id_len == uVar18) &&
               (iVar10 = bcmp((paVar6->key).id,(ppaVar5[uVar16]->key).id,(ulong)uVar18), iVar10 == 0
               )) goto LAB_00116732;
            *puVar12 = uVar17 | 0x10000 << (sbyte)uVar14;
            uVar17 = pmVar2->n_buckets;
            uVar14 = (int)uVar16 + iVar13;
            if (uVar14 < uVar17) {
              uVar17 = 0;
            }
            uVar14 = uVar14 - uVar17;
            uVar16 = (ulong)uVar14;
            puVar12 = pmVar4 + (uVar14 >> 4);
            uVar17 = *puVar12;
            uVar14 = uVar14 & 0xf;
          } while ((uVar17 >> uVar14 & 1) != 0);
        }
        if (((pmVar4[uVar16 >> 4] >> ((byte)uVar16 & 0xf)) >> 0x10 & 1) != 0) {
          uVar17 = pmVar2->n_buckets;
          uVar19 = uVar16;
          do {
            uVar18 = (int)uVar19 + iVar13;
            uVar14 = 0;
            if (uVar17 <= uVar18) {
              uVar14 = uVar17;
            }
            uVar18 = uVar18 - uVar14;
            uVar19 = (ulong)uVar18;
            uVar14 = pmVar4[uVar18 >> 4];
            if ((uVar14 >> (uVar18 & 0xf) & 1) != 0) {
              uVar1 = (ppaVar3[uVar15]->key).id_len;
              if (((pmVar2->p[uVar19]->key).id_len == uVar1) &&
                 (iVar10 = bcmp((pmVar2->p[uVar19]->key).id,(ppaVar3[uVar15]->key).id,(ulong)uVar1),
                 iVar10 == 0)) {
                uVar16 = (ulong)uVar18;
                break;
              }
            }
          } while (((uVar14 >> (sbyte)(uVar18 & 0xf)) >> 0x10 & 1) != 0);
        }
LAB_00116732:
        pmVar2->p[uVar16] = h->p[uVar15];
        pmVar2->b[uVar16 >> 4] = pmVar2->b[uVar16 >> 4] | 1 << ((byte)uVar16 & 0xf);
        pmVar2->n_dirty = pmVar2->n_dirty + 1;
      }
      uVar15 = uVar15 + 1;
    } while (uVar15 < h->n_buckets);
  }
  tnt_mem_free(h->p);
  tnt_mem_free(h->b);
  pmVar2->size = h->size;
  ppaVar3 = pmVar2->p;
  pmVar4 = pmVar2->b;
  mVar11 = pmVar2->resize_cnt;
  mVar7 = pmVar2->resize_position;
  mVar8 = pmVar2->batch;
  h->prime = pmVar2->prime;
  h->resize_cnt = mVar11;
  h->resize_position = mVar7;
  h->batch = mVar8;
  h->shadow = pmVar2->shadow;
  h->p = ppaVar3;
  h->b = pmVar4;
  mVar11 = pmVar2->n_dirty;
  mVar7 = pmVar2->size;
  mVar8 = pmVar2->upper_bound;
  h->n_buckets = pmVar2->n_buckets;
  h->n_dirty = mVar11;
  h->size = mVar7;
  h->upper_bound = mVar8;
  h->resize_cnt = h->resize_cnt + 1;
  return;
}

Assistant:

void
_mh(resize)(struct _mh(t) *h,
	    mh_arg_t arg)
{
	struct _mh(t) *s = h->shadow;
#if MH_INCREMENTAL_RESIZE
	mh_int_t  batch = h->batch;
#endif
	mh_int_t i = 0;
	for (i = h->resize_position; i < h->n_buckets; i++) {
#if MH_INCREMENTAL_RESIZE
		if (batch-- == 0) {
			h->resize_position = i;
			return;
		}
#endif
		if (!mh_exist(h, i))
			continue;
		mh_int_t n = put_slot(s, mh_node(h, i), arg);
		s->p[n] = h->p[i];
		mh_setexist(s, n);
		s->n_dirty++;
	}
	MH_FREE(h->p);
	MH_FREE(h->b);
	s->size = h->size;
	memcpy(h, s, sizeof(*h));
	h->resize_cnt++;
}